

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O2

QLatin1StringView language::lookupEnum<21>(EnumLookup (*array) [21],int value,int defaultIndex)

{
  long lVar1;
  long lVar2;
  qsizetype qVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x18 == 0x210) {
      qVar3 = (*array)[defaultIndex].valueString.m_size;
      pcVar4 = (*array)[defaultIndex].valueString.m_data;
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_20 = "default";
      QMessageLogger::warning
                (local_38,"uic: Warning: Invalid enumeration value %d, defaulting to %s",value,
                 pcVar4);
      goto LAB_00149931;
    }
    lVar1 = lVar2 + 0x18;
  } while (*(int *)((long)&(*array)[0].value + lVar2) != value);
  qVar3 = *(qsizetype *)((long)&(*array)[0].valueString.m_size + lVar2);
  pcVar4 = *(char **)((long)&(*array)[0].valueString.m_data + lVar2);
LAB_00149931:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar5.m_data = pcVar4;
    QVar5.m_size = qVar3;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QLatin1StringView lookupEnum(const EnumLookup(&array)[N], int value, int defaultIndex = 0)
{
    for (int i = 0; i < N; ++i) {
        if (value == array[i].value)
            return array[i].valueString;
    }
    auto defaultValue = array[defaultIndex].valueString;
    qWarning("uic: Warning: Invalid enumeration value %d, defaulting to %s",
             value, defaultValue.data());
    return defaultValue;
}